

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O1

CFGNode * __thiscall
dxil_spv::CFGStructurizer::create_helper_succ_block(CFGStructurizer *this,CFGNode *node)

{
  pointer pcVar1;
  pointer ppCVar2;
  pointer ppCVar3;
  pointer ppCVar4;
  CFGNode *pCVar5;
  CFGNode *pCVar6;
  uint32_t uVar7;
  Type TVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  CFGNode *new_node;
  basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> local_48;
  
  new_node = CFGNodePool::create_node(this->pool);
  pcVar1 = (node->name)._M_dataplus._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>::
  _M_construct<char*>((basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>
                       *)&local_48,pcVar1,pcVar1 + (node->name)._M_string_length);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
  append(&local_48,".succ");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
  operator=(&new_node->name,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    free_in_thread(local_48._M_dataplus._M_p);
  }
  new_node->forward_post_visit_order = node->forward_post_visit_order;
  new_node->backward_post_visit_order = node->backward_post_visit_order;
  ppCVar3 = (new_node->succ).
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppCVar4 = (new_node->succ).
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  ppCVar2 = (new_node->succ).
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (new_node->succ).
  super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (node->succ).
       super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (new_node->succ).
  super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (node->succ).
       super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (new_node->succ).
  super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (node->succ).
       super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (node->succ).
  super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
  _M_impl.super__Vector_impl_data._M_start = ppCVar3;
  (node->succ).
  super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = ppCVar4;
  (node->succ).
  super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = ppCVar2;
  new_node->immediate_post_dominator = node->immediate_post_dominator;
  node->immediate_post_dominator = new_node;
  uVar7 = (node->ir).terminator.conditional_id;
  TVar8 = (node->ir).terminator.type;
  pCVar5 = (node->ir).terminator.direct_block;
  pCVar6 = (node->ir).terminator.false_block;
  (new_node->ir).terminator.true_block = (node->ir).terminator.true_block;
  (new_node->ir).terminator.false_block = pCVar6;
  (new_node->ir).terminator.conditional_id = uVar7;
  (new_node->ir).terminator.type = TVar8;
  (new_node->ir).terminator.direct_block = pCVar5;
  std::
  vector<dxil_spv::Terminator::Case,_dxil_spv::ThreadLocalAllocator<dxil_spv::Terminator::Case>_>::
  operator=(&(new_node->ir).terminator.cases,&(node->ir).terminator.cases);
  bVar9 = (node->ir).terminator.force_unroll;
  bVar10 = (node->ir).terminator.force_loop;
  bVar11 = (node->ir).terminator.force_flatten;
  bVar12 = (node->ir).terminator.force_branch;
  (new_node->ir).terminator.return_value = (node->ir).terminator.return_value;
  (new_node->ir).terminator.force_unroll = bVar9;
  (new_node->ir).terminator.force_loop = bVar10;
  (new_node->ir).terminator.force_flatten = bVar11;
  (new_node->ir).terminator.force_branch = bVar12;
  (node->ir).terminator.type = Branch;
  (node->ir).terminator.direct_block = new_node;
  if ((new_node->ir).terminator.type == Condition) {
    (new_node->ir).merge_info.selection_control_mask = (node->ir).merge_info.selection_control_mask;
  }
  retarget_succ_from(this,new_node,node);
  CFGNode::add_branch(node,new_node);
  return new_node;
}

Assistant:

CFGNode *CFGStructurizer::create_helper_succ_block(CFGNode *node)
{
	auto *succ_node = pool.create_node();
	succ_node->name = node->name + ".succ";

	// Fixup visit order later.
	succ_node->forward_post_visit_order = node->forward_post_visit_order;
	succ_node->backward_post_visit_order = node->backward_post_visit_order;

	std::swap(succ_node->succ, node->succ);
	// Do not swap back edges, only forward edges.

	succ_node->immediate_post_dominator = node->immediate_post_dominator;
	node->immediate_post_dominator = succ_node;

	succ_node->ir.terminator = node->ir.terminator;
	node->ir.terminator.type = Terminator::Type::Branch;
	node->ir.terminator.direct_block = succ_node;

	// Inherit selection construct from parent since we're taking over any selection.
	if (succ_node->ir.terminator.type == Terminator::Type::Condition)
		succ_node->ir.merge_info.selection_control_mask = node->ir.merge_info.selection_control_mask;

	retarget_succ_from(succ_node, node);

	node->add_branch(succ_node);
	return succ_node;
}